

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void helper_mac_move_m68k(CPUM68KState_conflict *env,uint32_t dest,uint32_t src)

{
  uint uVar1;
  uint32_t mask;
  uint32_t src_local;
  uint32_t dest_local;
  CPUM68KState_conflict *env_local;
  
  env->macc[dest] = env->macc[src];
  uVar1 = 0x100 << ((byte)dest & 0x1f);
  if ((env->macsr & 0x100 << ((byte)src & 0x1f)) == 0) {
    env->macsr = (uVar1 ^ 0xffffffff) & env->macsr;
  }
  else {
    env->macsr = uVar1 | env->macsr;
  }
  return;
}

Assistant:

void HELPER(mac_move)(CPUM68KState *env, uint32_t dest, uint32_t src)
{
    uint32_t mask;
    env->macc[dest] = env->macc[src];
    mask = MACSR_PAV0 << dest;
    if (env->macsr & (MACSR_PAV0 << src))
        env->macsr |= mask;
    else
        env->macsr &= ~mask;
}